

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Window createHelperWindow(void)

{
  Window WVar1;
  undefined1 local_78 [8];
  XSetWindowAttributes wa;
  
  wa.save_under = 0x400000;
  wa._68_4_ = 0;
  WVar1 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,1,1,0,0,2,
                        *(undefined8 *)
                         (*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 + 0x40
                         ),0x800,local_78);
  return WVar1;
}

Assistant:

static Window createHelperWindow(void)
{
    XSetWindowAttributes wa;
    wa.event_mask = PropertyChangeMask;

    return XCreateWindow(_glfw.x11.display, _glfw.x11.root,
                         0, 0, 1, 1, 0, 0,
                         InputOnly,
                         DefaultVisual(_glfw.x11.display, _glfw.x11.screen),
                         CWEventMask, &wa);
}